

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObservationModelMapping.cpp
# Opt level: O0

void __thiscall
ObservationModelMapping::ObservationModelMapping
          (ObservationModelMapping *this,int nrS,int nrJA,int nrJO)

{
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *pmVar1;
  int in_EDX;
  value_type *in_RDI;
  int a;
  Matrix *O;
  undefined8 in_stack_ffffffffffffffb0;
  ObservationModelDiscrete *in_stack_ffffffffffffffc0;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *this_00;
  size_type in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar2;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *in_stack_ffffffffffffffe0;
  
  ObservationModelDiscrete::ObservationModelDiscrete
            (in_stack_ffffffffffffffc0,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
             (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
  *in_RDI = (value_type)&PTR__ObservationModelMapping_00d359f8;
  this_00 = (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
             *)(in_RDI + 3);
  std::
  vector<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ::vector((vector<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
            *)0xa9e521);
  for (iVar2 = 0; iVar2 != in_EDX; iVar2 = iVar2 + 1) {
    pmVar1 = (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
              *)operator_new(0x28);
    boost::numeric::ublas::
    matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
    ::matrix(in_stack_ffffffffffffffe0,CONCAT44(iVar2,in_stack_ffffffffffffffd8),
             in_stack_ffffffffffffffd0);
    boost::numeric::ublas::
    matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
    ::clear(this_00);
    std::
    vector<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
    ::push_back((vector<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
                 *)this_00,in_RDI);
    in_stack_ffffffffffffffe0 = pmVar1;
  }
  return;
}

Assistant:

ObservationModelMapping::ObservationModelMapping(int nrS, int nrJA,
                                                 int nrJO) : 
    ObservationModelDiscrete(nrS, nrJA, nrJO)
{
    Matrix *O;
    for(int a=0;a!=nrJA;++a)
    {
        O=new Matrix(nrS,nrJO);
        O->clear();
        _m_O.push_back(O);
    }
}